

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::detail::error_fetch_and_normalize::restore(error_fetch_and_normalize *this)

{
  handle *phVar1;
  PyObject *pPVar2;
  PyObject *this_00;
  PyObject *pPVar3;
  string *in_RDI;
  error_fetch_and_normalize *unaff_retaddr;
  handle *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  string *__lhs;
  
  if ((in_RDI[1].field_2._M_local_buf[9] & 1U) != 0) {
    __lhs = in_RDI;
    error_string_abi_cxx11_(unaff_retaddr);
    std::operator+((char *)__lhs,in_stack_fffffffffffffff0);
    pybind11_fail(in_RDI);
  }
  phVar1 = handle::inc_ref(in_stack_ffffffffffffffb0);
  pPVar2 = handle::ptr(phVar1);
  phVar1 = handle::inc_ref(in_stack_ffffffffffffffb0);
  this_00 = handle::ptr(phVar1);
  phVar1 = handle::inc_ref((handle *)this_00);
  pPVar3 = handle::ptr(phVar1);
  PyErr_Restore(pPVar2,this_00,pPVar3);
  in_RDI[1].field_2._M_local_buf[9] = '\x01';
  return;
}

Assistant:

void restore() {
        if (m_restore_called) {
            pybind11_fail("Internal error: pybind11::detail::error_fetch_and_normalize::restore() "
                          "called a second time. ORIGINAL ERROR: "
                          + error_string());
        }
        PyErr_Restore(m_type.inc_ref().ptr(), m_value.inc_ref().ptr(), m_trace.inc_ref().ptr());
        m_restore_called = true;
    }